

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventmultiplexer.cxx
# Opt level: O2

void __thiscall EventMultiplexer::prepareNextState(EventMultiplexer *this)

{
  pointer ppSVar1;
  StochasticEventGenerator *pSVar2;
  char cVar3;
  byte bVar4;
  ulong uVar5;
  uint amount;
  uint uVar6;
  uint uVar7;
  
  if ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
      stochNextStateIsPrepared == false) {
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochNextValue =
         (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
         stochCurrentValue;
    (this->super_StochasticEventGenerator).eventNextValue = false;
    if (this->multiMode == false) {
      uVar6 = 0;
      uVar7 = 0;
      while( true ) {
        ppSVar1 = (this->multiSources).
                  super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)(this->multiSources).
                      super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3;
        if (uVar5 <= uVar7) break;
        pSVar2 = ppSVar1[uVar7];
        if (pSVar2 != (StochasticEventGenerator *)0x0) {
          bVar4 = (**(code **)(*(long *)&(pSVar2->super_StochasticVariable).super_StochasticProcess.
                                         super_Parametric + 0x78))();
          uVar6 = uVar6 + bVar4;
        }
        uVar7 = uVar7 + 1;
      }
      if (uVar5 == uVar6) {
        (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
        stochNextValue =
             (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess
             .stochNextValue + 1.0;
        (this->super_StochasticEventGenerator).eventNextValue = true;
      }
    }
    else {
      uVar6 = 0;
      while( true ) {
        ppSVar1 = (this->multiSources).
                  super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->multiSources).
                          super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <=
            (ulong)uVar6) break;
        pSVar2 = ppSVar1[uVar6];
        if (pSVar2 != (StochasticEventGenerator *)0x0) {
          cVar3 = (**(code **)(*(long *)&(pSVar2->super_StochasticVariable).super_StochasticProcess.
                                         super_Parametric + 0x78))();
          if (cVar3 != '\0') {
            (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
            stochNextValue =
                 (this->super_StochasticEventGenerator).super_StochasticVariable.
                 super_StochasticProcess.stochNextValue + 1.0;
            (this->super_StochasticEventGenerator).eventNextValue = true;
          }
        }
        uVar6 = uVar6 + 1;
      }
    }
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochNextStateIsPrepared = true;
  }
  return;
}

Assistant:

void EventMultiplexer::prepareNextState()
{
    if (!stochNextStateIsPrepared) {
        stochNextValue = stochCurrentValue;
        eventNextValue = false;
        if (multiMode) {
            for (uint i=0; i<multiSources.size(); i++) {
                if (multiSources[i] && multiSources[i]->hasEvent()) {
                    stochNextValue += 1.0;
                    eventNextValue = true;
                }
            }
        } else {
            uint amount = 0;
            for (uint i=0; i<multiSources.size(); i++) {
                if (multiSources[i] && multiSources[i]->hasEvent())
                    ++amount;
            }
            if (amount == multiSources.size()) {
                stochNextValue += 1.0;
                eventNextValue = true;
            }
        }
        stochNextStateIsPrepared = true;
    }
}